

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O0

void __thiscall DCompatibilityMenu::Drawer(DCompatibilityMenu *this)

{
  EColorRange normalcolor;
  FFont *font;
  DFrameBuffer *this_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  char local_58 [8];
  char text [64];
  DCompatibilityMenu *this_local;
  
  DOptionMenu::Drawer(&this->super_DOptionMenu);
  uVar1 = FIntCVar::operator*(&compatflags);
  FIntCVar::operator*(&compatflags2);
  mysnprintf(local_58,0x40,"compatflags = %d  compatflags2 = %d",(ulong)uVar1);
  this_00 = screen;
  font = SmallFont;
  normalcolor = OptionSettings.mFontColorValue;
  iVar2 = DCanvas::GetWidth((DCanvas *)screen);
  iVar3 = FFont::StringWidth(SmallFont,local_58);
  DCanvas::DrawText((DCanvas *)this_00,font,normalcolor,(iVar2 - iVar3 * CleanXfac_1) / 2,0,local_58
                    ,0x40001394,1,0);
  return;
}

Assistant:

void Drawer ()
	{
		Super::Drawer();

		char text[64];
		mysnprintf(text, 64, "compatflags = %d  compatflags2 = %d", *compatflags, *compatflags2);
		screen->DrawText (SmallFont, OptionSettings.mFontColorValue,
			(screen->GetWidth() - SmallFont->StringWidth (text) * CleanXfac_1) / 2, 0, text,
			DTA_CleanNoMove_1, true, TAG_DONE);
	}